

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed
          (vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *__return_storage_ptr__,
          LegacyScriptPubKeyMan *this,int64_t keypool_id)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  undefined4 extraout_var;
  iterator __position;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *this_01;
  long in_FS_OFFSET;
  WalletBatch local_b8;
  int64_t keypool_id_local;
  CKeyID local_9c;
  CKeyPool keypool;
  WalletDatabase *pWVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
            &(this->super_LegacyDataSPKM).setInternalKeyPool;
  keypool_id_local = keypool_id;
  sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::count
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)this_01,&keypool_id_local)
  ;
  if (sVar4 == 0) {
    this_00 = &(this->super_LegacyDataSPKM).setExternalKeyPool;
    sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::count(this_00,&keypool_id_local)
    ;
    if ((sVar4 == 0) &&
       (sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::count
                          (&(this->super_LegacyDataSPKM).set_pre_split_keypool,&keypool_id_local),
       sVar4 == 0)) {
      __assert_fail("setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5ec,
                    "std::vector<CKeyPool> wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t)"
                   );
    }
    this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              &(this->super_LegacyDataSPKM).set_pre_split_keypool;
    if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
        _M_node_count == 0) {
      this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                this_00;
    }
  }
  __position._M_node = *(_Base_ptr *)(this_01 + 0x18);
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar5->_vptr_WalletDatabase[0xe])(&local_b8,pWVar5,1);
  local_b8.m_database = pWVar5;
  while ((__position._M_node != (_Base_ptr)(this_01 + 8) &&
         (*(long *)(__position._M_node + 1) <= keypool_id_local))) {
    CKeyPool::CKeyPool(&keypool);
    bVar2 = WalletBatch::ReadPool(&local_b8,*(int64_t *)(__position._M_node + 1),&keypool);
    if (bVar2) {
      CPubKey::GetID(&local_9c,&keypool.vchPubKey);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
      ::erase(&(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t,&local_9c);
    }
    LearnAllRelatedScripts(this,&keypool.vchPubKey);
    WalletBatch::ErasePool(&local_b8,*(int64_t *)(__position._M_node + 1));
    ScriptPubKeyMan::WalletLogPrintf<long>
              ((ScriptPubKeyMan *)this,"keypool index %d removed\n",
               *(long *)(__position._M_node + 1));
    __position = std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                 ::erase_abi_cxx11_(this_01,__position._M_node);
    std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::emplace_back<wallet::CKeyPool>
              (__return_storage_ptr__,&keypool);
  }
  if (local_b8.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_b8.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CKeyPool> LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t keypool_id)
{
    AssertLockHeld(cs_KeyStore);
    bool internal = setInternalKeyPool.count(keypool_id);
    if (!internal) assert(setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id));
    std::set<int64_t> *setKeyPool = internal ? &setInternalKeyPool : (set_pre_split_keypool.empty() ? &setExternalKeyPool : &set_pre_split_keypool);
    auto it = setKeyPool->begin();

    std::vector<CKeyPool> result;
    WalletBatch batch(m_storage.GetDatabase());
    while (it != std::end(*setKeyPool)) {
        const int64_t& index = *(it);
        if (index > keypool_id) break; // set*KeyPool is ordered

        CKeyPool keypool;
        if (batch.ReadPool(index, keypool)) { //TODO: This should be unnecessary
            m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        }
        LearnAllRelatedScripts(keypool.vchPubKey);
        batch.ErasePool(index);
        WalletLogPrintf("keypool index %d removed\n", index);
        it = setKeyPool->erase(it);
        result.push_back(std::move(keypool));
    }

    return result;
}